

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86.cpp
# Opt level: O3

int __thiscall
ncnn::LayerNorm_x86::forward_inplace(LayerNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  float *pfVar24;
  ulong uVar25;
  float *pfVar26;
  float _mean;
  float fVar27;
  float _a_3;
  __m128 _b_128;
  float _b;
  float _a;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar54;
  undefined1 auVar49 [16];
  float fVar55;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float *local_40;
  
  iVar17 = bottom_top_blob->elempack;
  iVar11 = bottom_top_blob->dims;
  iVar1 = bottom_top_blob->w;
  pp_Var2 = this->_vptr_LayerNorm_x86;
  p_Var3 = pp_Var2[-3];
  pfVar14 = *(float **)(&this->field_0xe0 + (long)p_Var3);
  local_40 = *(float **)(&this->field_0x128 + (long)p_Var3);
  if (iVar11 == 1) {
    uVar20 = iVar1 * iVar17;
    pfVar15 = (float *)bottom_top_blob->data;
    pfVar24 = pfVar15;
    if ((int)uVar20 < 4) {
      uVar18 = 0;
      fVar27 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
    }
    else {
      uVar18 = uVar20 & 0x7ffffffc;
      fVar27 = 0.0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      iVar17 = 4;
      do {
        fVar27 = fVar27 + *pfVar24;
        fVar30 = fVar30 + pfVar24[1];
        fVar31 = fVar31 + pfVar24[2];
        fVar32 = fVar32 + pfVar24[3];
        pfVar24 = pfVar24 + 4;
        iVar17 = iVar17 + 4;
      } while (iVar17 <= (int)uVar20);
    }
    fVar28 = 0.0;
    if (uVar20 - uVar18 != 0 && (int)uVar18 <= (int)uVar20) {
      lVar13 = 0;
      do {
        fVar28 = fVar28 + pfVar24[lVar13];
        lVar13 = lVar13 + 1;
      } while (uVar20 - uVar18 != (int)lVar13);
    }
    fVar27 = (fVar32 + fVar30 + fVar31 + fVar27 + fVar28) / (float)(int)uVar20;
    pfVar24 = pfVar15;
    if ((int)uVar20 < 4) {
      uVar18 = 0;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      fVar28 = 0.0;
    }
    else {
      uVar18 = uVar20 & 0x7ffffffc;
      fVar30 = 0.0;
      fVar31 = 0.0;
      fVar32 = 0.0;
      fVar28 = 0.0;
      iVar17 = 4;
      do {
        fVar30 = fVar30 + (*pfVar24 - fVar27) * (*pfVar24 - fVar27);
        fVar31 = fVar31 + (pfVar24[1] - fVar27) * (pfVar24[1] - fVar27);
        fVar32 = fVar32 + (pfVar24[2] - fVar27) * (pfVar24[2] - fVar27);
        fVar28 = fVar28 + (pfVar24[3] - fVar27) * (pfVar24[3] - fVar27);
        pfVar24 = pfVar24 + 4;
        iVar17 = iVar17 + 4;
      } while (iVar17 <= (int)uVar20);
    }
    auVar53._0_4_ = 0.0;
    if (uVar20 - uVar18 != 0 && (int)uVar18 <= (int)uVar20) {
      lVar13 = 0;
      do {
        auVar53._0_4_ = auVar53._0_4_ + (pfVar24[lVar13] - fVar27) * (pfVar24[lVar13] - fVar27);
        lVar13 = lVar13 + 1;
      } while (uVar20 - uVar18 != (int)lVar13);
    }
    fVar28 = fVar28 + fVar31;
    fVar31 = (fVar28 + fVar32 + fVar30 + auVar53._0_4_) / (float)(int)uVar20 +
             *(float *)(&this->field_0xd4 + (long)p_Var3);
    auVar49._4_4_ = fVar28;
    auVar49._0_4_ = fVar31;
    auVar49._8_4_ = fVar28;
    auVar49._12_4_ = fVar28;
    auVar53 = rsqrtss(ZEXT816(0),auVar49);
    fVar30 = auVar53._0_4_;
    fVar30 = fVar30 * -0.5 * (fVar31 * fVar30 * fVar30 + -3.0);
    fVar27 = -fVar27 * fVar30;
    if (*(int *)(&this->field_0xd8 + (long)p_Var3) == 0) {
      uVar18 = 0;
      if (3 < (int)uVar20) {
        uVar18 = uVar20 & 0x7ffffffc;
        iVar17 = 4;
        do {
          *pfVar15 = *pfVar15 * fVar30 + fVar27;
          pfVar15[1] = pfVar15[1] * fVar30 + fVar27;
          pfVar15[2] = pfVar15[2] * fVar30 + fVar27;
          pfVar15[3] = pfVar15[3] * fVar30 + fVar27;
          pfVar15 = pfVar15 + 4;
          iVar17 = iVar17 + 4;
        } while (iVar17 <= (int)uVar20);
      }
      if (uVar20 - uVar18 != 0 && (int)uVar18 <= (int)uVar20) {
        lVar13 = 0;
        do {
          pfVar15[lVar13] = pfVar15[lVar13] * fVar30 + fVar27;
          lVar13 = lVar13 + 1;
        } while (uVar20 - uVar18 != (int)lVar13);
      }
    }
    else {
      uVar18 = 0;
      if (3 < (int)uVar20) {
        uVar18 = uVar20 & 0x7ffffffc;
        iVar17 = 4;
        do {
          fVar31 = pfVar14[1];
          fVar32 = pfVar14[2];
          fVar28 = pfVar14[3];
          auVar53._0_4_ = local_40[1];
          auVar39._0_4_ = local_40[2];
          auVar36._0_4_ = local_40[3];
          *pfVar15 = (*pfVar15 * fVar30 + fVar27) * *pfVar14 + *local_40;
          pfVar15[1] = (pfVar15[1] * fVar30 + fVar27) * fVar31 + auVar53._0_4_;
          pfVar15[2] = (pfVar15[2] * fVar30 + fVar27) * fVar32 + auVar39._0_4_;
          pfVar15[3] = (pfVar15[3] * fVar30 + fVar27) * fVar28 + auVar36._0_4_;
          pfVar15 = pfVar15 + 4;
          pfVar14 = pfVar14 + 4;
          local_40 = local_40 + 4;
          iVar17 = iVar17 + 4;
        } while (iVar17 <= (int)uVar20);
      }
      if (uVar20 - uVar18 != 0 && (int)uVar18 <= (int)uVar20) {
        lVar13 = 0;
        do {
          pfVar15[lVar13] = (pfVar15[lVar13] * fVar30 + fVar27) * pfVar14[lVar13] + local_40[lVar13]
          ;
          lVar13 = lVar13 + 1;
        } while (uVar20 - uVar18 != (int)lVar13);
      }
    }
  }
  else {
    uVar20 = bottom_top_blob->h;
    if (iVar11 == 3) {
      uVar18 = bottom_top_blob->c;
      if (*(int *)(&this->field_0xd0 + (long)p_Var3) == iVar1) {
        if (0 < (int)uVar18) {
          uVar19 = iVar1 * iVar17;
          fVar27 = 1.0 / (float)iVar1;
          uVar21 = uVar19 & 0xfffffffc;
          uVar16 = 0;
          do {
            if (0 < (int)uVar20) {
              uVar25 = 0;
              do {
                pauVar22 = (undefined1 (*) [16])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar25 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * uVar16 * bottom_top_blob->elemsize);
                pauVar23 = pauVar22;
                if ((int)uVar19 < 4) {
                  fVar28 = 0.0;
                  fVar30 = 0.0;
                  fVar31 = 0.0;
                  fVar32 = 0.0;
                  uVar12 = 0;
                }
                else {
                  fVar28 = 0.0;
                  fVar30 = 0.0;
                  fVar31 = 0.0;
                  fVar32 = 0.0;
                  iVar11 = 4;
                  do {
                    fVar28 = fVar28 + *(float *)*pauVar23;
                    fVar30 = fVar30 + *(float *)(*pauVar23 + 4);
                    fVar31 = fVar31 + *(float *)(*pauVar23 + 8);
                    fVar32 = fVar32 + *(float *)(*pauVar23 + 0xc);
                    pauVar23 = pauVar23 + 1;
                    iVar11 = iVar11 + 4;
                    uVar12 = uVar21;
                  } while (iVar11 <= (int)uVar19);
                }
                auVar53._0_4_ = 0.0;
                if (uVar19 - uVar12 != 0 && (int)uVar12 <= (int)uVar19) {
                  lVar13 = 0;
                  do {
                    auVar53._0_4_ = auVar53._0_4_ + *(float *)(*pauVar23 + lVar13 * 4);
                    lVar13 = lVar13 + 1;
                  } while (uVar19 - uVar12 != (int)lVar13);
                }
                if (iVar17 == 1) {
                  fVar32 = fVar32 + fVar30;
                  auVar38._4_4_ = fVar32;
                  auVar38._0_4_ = fVar32;
                  auVar38._8_4_ = fVar32;
                  auVar38._12_4_ = fVar32;
                  auVar39._4_12_ = auVar38._4_12_;
                  auVar39._0_4_ = (fVar32 + fVar31 + fVar28 + auVar53._0_4_) * fVar27;
                  auVar37 = auVar39;
LAB_004d3892:
                  fVar32 = 0.0;
                  fVar31 = 0.0;
                  fVar30 = 0.0;
                  fVar28 = auVar37._0_4_;
                  bVar10 = false;
                  auVar53._0_4_ = fVar28;
                  auVar36._0_4_ = fVar28;
                  fVar33 = fVar28;
                }
                else {
                  auVar39._0_4_ = 0.0;
                  auVar37 = ZEXT816(0);
                  if (iVar17 != 4) goto LAB_004d3892;
                  auVar39._0_4_ = fVar28 * fVar27;
                  fVar30 = fVar30 * fVar27;
                  fVar31 = fVar31 * fVar27;
                  fVar32 = fVar32 * fVar27;
                  bVar10 = true;
                  auVar37._4_4_ = fVar30;
                  auVar37._0_4_ = auVar39._0_4_;
                  auVar37._8_4_ = fVar31;
                  auVar37._12_4_ = fVar32;
                  fVar28 = auVar39._0_4_;
                  auVar53._0_4_ = fVar30;
                  auVar36._0_4_ = fVar31;
                  fVar33 = fVar32;
                }
                pauVar23 = pauVar22;
                if ((int)uVar19 < 4) {
                  fVar44 = 0.0;
                  fVar46 = 0.0;
                  fVar47 = 0.0;
                  fVar48 = 0.0;
                  uVar12 = 0;
                }
                else {
                  fVar44 = 0.0;
                  fVar46 = 0.0;
                  fVar47 = 0.0;
                  fVar48 = 0.0;
                  iVar11 = 4;
                  do {
                    fVar29 = *(float *)*pauVar23 - fVar28;
                    fVar45 = *(float *)(*pauVar23 + 4) - auVar53._0_4_;
                    fVar54 = *(float *)(*pauVar23 + 8) - auVar36._0_4_;
                    fVar55 = *(float *)(*pauVar23 + 0xc) - fVar33;
                    fVar44 = fVar44 + fVar29 * fVar29;
                    fVar46 = fVar46 + fVar45 * fVar45;
                    fVar47 = fVar47 + fVar54 * fVar54;
                    fVar48 = fVar48 + fVar55 * fVar55;
                    pauVar23 = pauVar23 + 1;
                    iVar11 = iVar11 + 4;
                    uVar12 = uVar21;
                  } while (iVar11 <= (int)uVar19);
                }
                auVar50 = ZEXT816(0);
                if (uVar19 - uVar12 != 0 && (int)uVar12 <= (int)uVar19) {
                  lVar13 = 0;
                  do {
                    fVar28 = *(float *)(*pauVar23 + lVar13 * 4) - auVar37._0_4_;
                    auVar50._0_4_ = auVar50._0_4_ + fVar28 * fVar28;
                    lVar13 = lVar13 + 1;
                  } while (uVar19 - uVar12 != (int)lVar13);
                }
                if (bVar10) {
                  fVar28 = fVar44 * fVar27;
                  auVar53._0_4_ = fVar46 * fVar27;
                  auVar36._0_4_ = fVar47 * fVar27;
                  fVar33 = fVar48 * fVar27;
                }
                else {
                  fVar28 = 0.0;
                  auVar53._0_4_ = 0.0;
                  auVar36._0_4_ = 0.0;
                  fVar33 = 0.0;
                }
                fVar29 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
                if (iVar17 == 1) {
                  fVar48 = fVar48 + fVar46;
                  fVar29 = (fVar48 + fVar47 + fVar44 + auVar50._0_4_) * fVar27 + fVar29;
                  auVar8._4_4_ = fVar48;
                  auVar8._0_4_ = fVar29;
                  auVar8._8_4_ = fVar48;
                  auVar8._12_4_ = fVar48;
                  auVar49 = rsqrtss(ZEXT816(0),auVar8);
                  fVar28 = auVar49._0_4_;
                  fVar28 = fVar28 * -0.5 * (fVar29 * fVar28 * fVar28 + -3.0);
                  auVar39._0_4_ = -auVar37._0_4_ * fVar28;
                }
                else if (iVar17 == 4) {
                  auVar5._4_4_ = auVar53._0_4_ + fVar29;
                  auVar5._0_4_ = fVar28 + fVar29;
                  auVar5._8_4_ = auVar36._0_4_ + fVar29;
                  auVar5._12_4_ = fVar33 + fVar29;
                  auVar49 = rsqrtps(auVar37,auVar5);
                  fVar44 = auVar49._0_4_;
                  fVar46 = auVar49._4_4_;
                  fVar47 = auVar49._8_4_;
                  fVar48 = auVar49._12_4_;
                  fVar28 = ((fVar28 + fVar29) * fVar44 * fVar44 + -3.0) * fVar44 * -0.5;
                  auVar53._0_4_ =
                       ((auVar53._0_4_ + fVar29) * fVar46 * fVar46 + -3.0) * fVar46 * -0.5;
                  auVar36._0_4_ =
                       ((auVar36._0_4_ + fVar29) * fVar47 * fVar47 + -3.0) * fVar47 * -0.5;
                  fVar33 = ((fVar33 + fVar29) * fVar48 * fVar48 + -3.0) * fVar48 * -0.5;
                  auVar39._0_4_ = -auVar39._0_4_ * fVar28;
                  fVar30 = -fVar30 * auVar53._0_4_;
                  fVar31 = -fVar31 * auVar36._0_4_;
                  fVar32 = -fVar32 * fVar33;
                }
                if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
                  auVar41._4_4_ = auVar53._0_4_;
                  auVar41._0_4_ = fVar28;
                  auVar41._8_4_ = auVar36._0_4_;
                  auVar41._12_4_ = fVar33;
                  if (!bVar10) {
                    auVar41._4_4_ = fVar28;
                    auVar41._8_4_ = fVar28;
                    auVar41._12_4_ = fVar28;
                    fVar30 = auVar39._0_4_;
                    fVar31 = auVar39._0_4_;
                    fVar32 = auVar39._0_4_;
                  }
                  uVar12 = 0;
                  if (3 < (int)uVar19) {
                    iVar11 = 4;
                    do {
                      auVar51._0_4_ = *(float *)*pauVar22 * auVar41._0_4_ + auVar39._0_4_;
                      auVar51._4_4_ = *(float *)(*pauVar22 + 4) * auVar41._4_4_ + fVar30;
                      auVar51._8_4_ = *(float *)(*pauVar22 + 8) * auVar41._8_4_ + fVar31;
                      auVar51._12_4_ = *(float *)(*pauVar22 + 0xc) * auVar41._12_4_ + fVar32;
                      *pauVar22 = auVar51;
                      pauVar22 = pauVar22 + 1;
                      iVar11 = iVar11 + 4;
                      uVar12 = uVar21;
                    } while (iVar11 <= (int)uVar19);
                  }
                  if (uVar19 - uVar12 != 0 && (int)uVar12 <= (int)uVar19) {
                    lVar13 = 0;
                    do {
                      *(float *)(*pauVar22 + lVar13 * 4) =
                           *(float *)(*pauVar22 + lVar13 * 4) * fVar28 + auVar39._0_4_;
                      lVar13 = lVar13 + 1;
                    } while (uVar19 - uVar12 != (int)lVar13);
                  }
                }
                else {
                  pfVar15 = pfVar14;
                  pfVar24 = local_40;
                  if ((bool)(bVar10 & 3 < (int)uVar19)) {
                    iVar11 = 4;
                    do {
                      fVar44 = *pfVar15;
                      fVar46 = *pfVar24;
                      auVar40._0_4_ =
                           (*(float *)*pauVar22 * fVar28 + auVar39._0_4_) * fVar44 + fVar46;
                      auVar40._4_4_ =
                           (*(float *)(*pauVar22 + 4) * auVar53._0_4_ + fVar30) * fVar44 + fVar46;
                      auVar40._8_4_ =
                           (*(float *)(*pauVar22 + 8) * auVar36._0_4_ + fVar31) * fVar44 + fVar46;
                      auVar40._12_4_ =
                           (*(float *)(*pauVar22 + 0xc) * fVar33 + fVar32) * fVar44 + fVar46;
                      *pauVar22 = auVar40;
                      pauVar22 = pauVar22 + 1;
                      pfVar15 = pfVar15 + 1;
                      pfVar24 = pfVar24 + 1;
                      iVar11 = iVar11 + 4;
                    } while (iVar11 <= (int)uVar19);
                  }
                  if (iVar17 == 1) {
                    uVar12 = 0;
                    if (3 < (int)uVar19) {
                      iVar11 = 4;
                      do {
                        auVar52._0_4_ =
                             *pfVar24 + *pfVar15 * (*(float *)*pauVar22 * fVar28 + auVar39._0_4_);
                        auVar52._4_4_ =
                             pfVar24[1] +
                             pfVar15[1] * (*(float *)(*pauVar22 + 4) * fVar28 + auVar39._0_4_);
                        auVar52._8_4_ =
                             pfVar24[2] +
                             pfVar15[2] * (*(float *)(*pauVar22 + 8) * fVar28 + auVar39._0_4_);
                        auVar52._12_4_ =
                             pfVar24[3] +
                             pfVar15[3] * (*(float *)(*pauVar22 + 0xc) * fVar28 + auVar39._0_4_);
                        *pauVar22 = auVar52;
                        pauVar22 = pauVar22 + 1;
                        pfVar15 = pfVar15 + 4;
                        pfVar24 = pfVar24 + 4;
                        iVar11 = iVar11 + 4;
                        uVar12 = uVar21;
                      } while (iVar11 <= (int)uVar19);
                    }
                    if (uVar19 - uVar12 != 0 && (int)uVar12 <= (int)uVar19) {
                      lVar13 = 0;
                      do {
                        *(float *)(*pauVar22 + lVar13 * 4) =
                             (*(float *)(*pauVar22 + lVar13 * 4) * fVar28 + auVar39._0_4_) *
                             pfVar15[lVar13] + pfVar24[lVar13];
                        lVar13 = lVar13 + 1;
                      } while (uVar19 - uVar12 != (int)lVar13);
                    }
                  }
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar20);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != uVar18);
        }
      }
      else if (0 < (int)uVar18) {
        uVar21 = uVar20 * iVar1 * iVar17;
        fVar27 = 1.0 / (float)(int)(uVar20 * iVar1);
        uVar20 = uVar21 & 0xfffffffc;
        uVar16 = 0;
        do {
          pfVar24 = (float *)(bottom_top_blob->cstep * uVar16 * bottom_top_blob->elemsize +
                             (long)bottom_top_blob->data);
          fVar28 = 0.0;
          fVar30 = 0.0;
          fVar31 = 0.0;
          fVar32 = 0.0;
          pfVar15 = pfVar24;
          uVar19 = 0;
          if (3 < (int)uVar21) {
            iVar11 = 4;
            do {
              fVar28 = fVar28 + *pfVar15;
              fVar30 = fVar30 + pfVar15[1];
              fVar31 = fVar31 + pfVar15[2];
              fVar32 = fVar32 + pfVar15[3];
              pfVar15 = pfVar15 + 4;
              iVar11 = iVar11 + 4;
              uVar19 = uVar20;
            } while (iVar11 <= (int)uVar21);
          }
          auVar53._0_4_ = 0.0;
          if (uVar21 - uVar19 != 0 && (int)uVar19 <= (int)uVar21) {
            lVar13 = 0;
            do {
              auVar53._0_4_ = auVar53._0_4_ + pfVar15[lVar13];
              lVar13 = lVar13 + 1;
            } while (uVar21 - uVar19 != (int)lVar13);
          }
          if (iVar17 == 1) {
            fVar32 = fVar32 + fVar30;
            auVar43._4_4_ = fVar32;
            auVar43._0_4_ = fVar32;
            auVar43._8_4_ = fVar32;
            auVar43._12_4_ = fVar32;
            auVar53._4_12_ = auVar43._4_12_;
            auVar53._0_4_ = (fVar32 + fVar31 + fVar28 + auVar53._0_4_) * fVar27;
            auVar42 = auVar53;
LAB_004d3c96:
            fVar32 = 0.0;
            fVar31 = 0.0;
            fVar30 = 0.0;
            fVar28 = auVar42._0_4_;
            bVar10 = false;
            auVar39._0_4_ = fVar28;
            auVar36._0_4_ = fVar28;
            fVar33 = fVar28;
          }
          else {
            auVar53._0_4_ = 0.0;
            auVar42 = ZEXT816(0);
            if (iVar17 != 4) goto LAB_004d3c96;
            auVar53._0_4_ = fVar28 * fVar27;
            fVar30 = fVar30 * fVar27;
            fVar31 = fVar31 * fVar27;
            fVar32 = fVar32 * fVar27;
            bVar10 = true;
            auVar42._4_4_ = fVar30;
            auVar42._0_4_ = auVar53._0_4_;
            auVar42._8_4_ = fVar31;
            auVar42._12_4_ = fVar32;
            fVar28 = auVar53._0_4_;
            auVar39._0_4_ = fVar30;
            auVar36._0_4_ = fVar31;
            fVar33 = fVar32;
          }
          pfVar15 = pfVar24;
          if ((int)uVar21 < 4) {
            fVar44 = 0.0;
            fVar46 = 0.0;
            fVar47 = 0.0;
            fVar48 = 0.0;
            uVar19 = 0;
          }
          else {
            fVar44 = 0.0;
            fVar46 = 0.0;
            fVar47 = 0.0;
            fVar48 = 0.0;
            iVar11 = 4;
            do {
              fVar44 = fVar44 + (*pfVar15 - fVar28) * (*pfVar15 - fVar28);
              fVar46 = fVar46 + (pfVar15[1] - auVar39._0_4_) * (pfVar15[1] - auVar39._0_4_);
              fVar47 = fVar47 + (pfVar15[2] - auVar36._0_4_) * (pfVar15[2] - auVar36._0_4_);
              fVar48 = fVar48 + (pfVar15[3] - fVar33) * (pfVar15[3] - fVar33);
              pfVar15 = pfVar15 + 4;
              iVar11 = iVar11 + 4;
              uVar19 = uVar20;
            } while (iVar11 <= (int)uVar21);
          }
          fVar28 = 0.0;
          if (uVar21 - uVar19 != 0 && (int)uVar19 <= (int)uVar21) {
            lVar13 = 0;
            do {
              auVar39._0_4_ = pfVar15[lVar13] - auVar42._0_4_;
              fVar28 = fVar28 + auVar39._0_4_ * auVar39._0_4_;
              lVar13 = lVar13 + 1;
            } while (uVar21 - uVar19 != (int)lVar13);
          }
          if (bVar10) {
            fVar29 = fVar44 * fVar27;
            auVar39._0_4_ = fVar46 * fVar27;
            auVar36._0_4_ = fVar47 * fVar27;
            fVar33 = fVar48 * fVar27;
          }
          else {
            fVar29 = 0.0;
            auVar39._0_4_ = 0.0;
            auVar36._0_4_ = 0.0;
            fVar33 = 0.0;
          }
          fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
          if (iVar17 == 1) {
            fVar48 = fVar48 + fVar46;
            fVar45 = (fVar48 + fVar47 + fVar44 + fVar28) * fVar27 + fVar45;
            auVar9._4_4_ = fVar48;
            auVar9._0_4_ = fVar45;
            auVar9._8_4_ = fVar48;
            auVar9._12_4_ = fVar48;
            auVar53 = rsqrtss(ZEXT816(0),auVar9);
            fVar28 = auVar53._0_4_;
            fVar29 = fVar28 * -0.5 * (fVar45 * fVar28 * fVar28 + -3.0);
            auVar53._0_4_ = -auVar42._0_4_ * fVar29;
          }
          else if (iVar17 == 4) {
            auVar6._4_4_ = auVar39._0_4_ + fVar45;
            auVar6._0_4_ = fVar29 + fVar45;
            auVar6._8_4_ = auVar36._0_4_ + fVar45;
            auVar6._12_4_ = fVar33 + fVar45;
            auVar49 = rsqrtps(auVar42,auVar6);
            fVar28 = auVar49._0_4_;
            fVar44 = auVar49._4_4_;
            fVar46 = auVar49._8_4_;
            fVar47 = auVar49._12_4_;
            fVar29 = ((fVar29 + fVar45) * fVar28 * fVar28 + -3.0) * fVar28 * -0.5;
            auVar39._0_4_ = ((auVar39._0_4_ + fVar45) * fVar44 * fVar44 + -3.0) * fVar44 * -0.5;
            auVar36._0_4_ = ((auVar36._0_4_ + fVar45) * fVar46 * fVar46 + -3.0) * fVar46 * -0.5;
            fVar33 = ((fVar33 + fVar45) * fVar47 * fVar47 + -3.0) * fVar47 * -0.5;
            auVar53._0_4_ = -auVar53._0_4_ * fVar29;
            fVar30 = -fVar30 * auVar39._0_4_;
            fVar31 = -fVar31 * auVar36._0_4_;
            fVar32 = -fVar32 * fVar33;
          }
          if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
            if (!bVar10) {
              fVar30 = auVar53._0_4_;
              fVar31 = auVar53._0_4_;
              fVar32 = auVar53._0_4_;
              auVar39._0_4_ = fVar29;
              auVar36._0_4_ = fVar29;
              fVar33 = fVar29;
            }
            uVar19 = 0;
            if (3 < (int)uVar21) {
              iVar11 = 4;
              do {
                *pfVar24 = *pfVar24 * fVar29 + auVar53._0_4_;
                pfVar24[1] = pfVar24[1] * auVar39._0_4_ + fVar30;
                pfVar24[2] = pfVar24[2] * auVar36._0_4_ + fVar31;
                pfVar24[3] = pfVar24[3] * fVar33 + fVar32;
                pfVar24 = pfVar24 + 4;
                iVar11 = iVar11 + 4;
                uVar19 = uVar20;
              } while (iVar11 <= (int)uVar21);
            }
            if (uVar21 - uVar19 != 0 && (int)uVar19 <= (int)uVar21) {
              lVar13 = 0;
              do {
                pfVar24[lVar13] = pfVar24[lVar13] * fVar29 + auVar53._0_4_;
                lVar13 = lVar13 + 1;
              } while (uVar21 - uVar19 != (int)lVar13);
            }
          }
          else {
            pfVar15 = pfVar14;
            pfVar26 = local_40;
            if (bVar10 && 3 < (int)uVar21) {
              iVar11 = 4;
              do {
                fVar28 = *pfVar15;
                fVar44 = *pfVar26;
                *pfVar24 = (*pfVar24 * fVar29 + auVar53._0_4_) * fVar28 + fVar44;
                pfVar24[1] = (pfVar24[1] * auVar39._0_4_ + fVar30) * fVar28 + fVar44;
                pfVar24[2] = (pfVar24[2] * auVar36._0_4_ + fVar31) * fVar28 + fVar44;
                pfVar24[3] = (pfVar24[3] * fVar33 + fVar32) * fVar28 + fVar44;
                pfVar24 = pfVar24 + 4;
                pfVar15 = pfVar15 + 1;
                pfVar26 = pfVar26 + 1;
                iVar11 = iVar11 + 4;
              } while (iVar11 <= (int)uVar21);
            }
            if (iVar17 == 1) {
              uVar19 = 0;
              if (3 < (int)uVar21) {
                iVar11 = 4;
                do {
                  fVar30 = pfVar15[1];
                  fVar31 = pfVar15[2];
                  fVar32 = pfVar15[3];
                  fVar28 = pfVar26[1];
                  auVar39._0_4_ = pfVar26[2];
                  auVar36._0_4_ = pfVar26[3];
                  *pfVar24 = *pfVar26 + *pfVar15 * (*pfVar24 * fVar29 + auVar53._0_4_);
                  pfVar24[1] = fVar28 + fVar30 * (pfVar24[1] * fVar29 + auVar53._0_4_);
                  pfVar24[2] = auVar39._0_4_ + fVar31 * (pfVar24[2] * fVar29 + auVar53._0_4_);
                  pfVar24[3] = auVar36._0_4_ + fVar32 * (pfVar24[3] * fVar29 + auVar53._0_4_);
                  pfVar24 = pfVar24 + 4;
                  pfVar15 = pfVar15 + 4;
                  pfVar26 = pfVar26 + 4;
                  iVar11 = iVar11 + 4;
                  uVar19 = uVar20;
                } while (iVar11 <= (int)uVar21);
              }
              if (uVar21 - uVar19 != 0 && (int)uVar19 <= (int)uVar21) {
                lVar13 = 0;
                do {
                  pfVar24[lVar13] =
                       (pfVar24[lVar13] * fVar29 + auVar53._0_4_) * pfVar15[lVar13] +
                       pfVar26[lVar13];
                  lVar13 = lVar13 + 1;
                } while (uVar21 - uVar19 != (int)lVar13);
              }
            }
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar18);
      }
    }
    else if ((iVar11 == 2) && (0 < (int)uVar20)) {
      uVar18 = iVar1 * iVar17;
      fVar27 = 1.0 / (float)iVar1;
      uVar21 = uVar18 & 0xfffffffc;
      uVar16 = 0;
      do {
        pfVar24 = (float *)((long)bottom_top_blob->w * uVar16 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        fVar28 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        pfVar15 = pfVar24;
        uVar19 = 0;
        if (3 < (int)uVar18) {
          iVar11 = 4;
          do {
            fVar28 = fVar28 + *pfVar15;
            fVar30 = fVar30 + pfVar15[1];
            fVar31 = fVar31 + pfVar15[2];
            fVar32 = fVar32 + pfVar15[3];
            pfVar15 = pfVar15 + 4;
            iVar11 = iVar11 + 4;
            uVar19 = uVar21;
          } while (iVar11 <= (int)uVar18);
        }
        auVar53._0_4_ = 0.0;
        if (uVar18 - uVar19 != 0 && (int)uVar19 <= (int)uVar18) {
          lVar13 = 0;
          do {
            auVar53._0_4_ = auVar53._0_4_ + pfVar15[lVar13];
            lVar13 = lVar13 + 1;
          } while (uVar18 - uVar19 != (int)lVar13);
        }
        if (iVar17 == 1) {
          fVar32 = fVar32 + fVar30;
          auVar35._4_4_ = fVar32;
          auVar35._0_4_ = fVar32;
          auVar35._8_4_ = fVar32;
          auVar35._12_4_ = fVar32;
          auVar36._4_12_ = auVar35._4_12_;
          auVar36._0_4_ = (fVar32 + fVar31 + fVar28 + auVar53._0_4_) * fVar27;
          auVar34 = auVar36;
LAB_004d349d:
          fVar32 = 0.0;
          fVar31 = 0.0;
          fVar30 = 0.0;
          fVar28 = auVar34._0_4_;
          bVar10 = false;
          auVar53._0_4_ = fVar28;
          auVar39._0_4_ = fVar28;
          fVar33 = fVar28;
        }
        else {
          auVar36._0_4_ = 0.0;
          auVar34 = ZEXT816(0);
          if (iVar17 != 4) goto LAB_004d349d;
          auVar36._0_4_ = fVar28 * fVar27;
          fVar30 = fVar30 * fVar27;
          fVar31 = fVar31 * fVar27;
          fVar32 = fVar32 * fVar27;
          bVar10 = true;
          auVar34._4_4_ = fVar30;
          auVar34._0_4_ = auVar36._0_4_;
          auVar34._8_4_ = fVar31;
          auVar34._12_4_ = fVar32;
          fVar28 = auVar36._0_4_;
          auVar53._0_4_ = fVar30;
          auVar39._0_4_ = fVar31;
          fVar33 = fVar32;
        }
        pfVar15 = pfVar24;
        if ((int)uVar18 < 4) {
          fVar44 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
          uVar19 = 0;
        }
        else {
          fVar44 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar48 = 0.0;
          iVar11 = 4;
          do {
            fVar44 = fVar44 + (*pfVar15 - fVar28) * (*pfVar15 - fVar28);
            fVar46 = fVar46 + (pfVar15[1] - auVar53._0_4_) * (pfVar15[1] - auVar53._0_4_);
            fVar47 = fVar47 + (pfVar15[2] - auVar39._0_4_) * (pfVar15[2] - auVar39._0_4_);
            fVar48 = fVar48 + (pfVar15[3] - fVar33) * (pfVar15[3] - fVar33);
            pfVar15 = pfVar15 + 4;
            iVar11 = iVar11 + 4;
            uVar19 = uVar21;
          } while (iVar11 <= (int)uVar18);
        }
        fVar28 = 0.0;
        if (uVar18 - uVar19 != 0 && (int)uVar19 <= (int)uVar18) {
          lVar13 = 0;
          do {
            auVar53._0_4_ = pfVar15[lVar13] - auVar34._0_4_;
            fVar28 = fVar28 + auVar53._0_4_ * auVar53._0_4_;
            lVar13 = lVar13 + 1;
          } while (uVar18 - uVar19 != (int)lVar13);
        }
        if (bVar10) {
          fVar29 = fVar44 * fVar27;
          auVar53._0_4_ = fVar46 * fVar27;
          auVar39._0_4_ = fVar47 * fVar27;
          fVar33 = fVar48 * fVar27;
        }
        else {
          fVar29 = 0.0;
          auVar53._0_4_ = 0.0;
          auVar39._0_4_ = 0.0;
          fVar33 = 0.0;
        }
        fVar45 = *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
        if (iVar17 == 1) {
          fVar48 = fVar48 + fVar46;
          fVar45 = (fVar48 + fVar47 + fVar44 + fVar28) * fVar27 + fVar45;
          auVar7._4_4_ = fVar48;
          auVar7._0_4_ = fVar45;
          auVar7._8_4_ = fVar48;
          auVar7._12_4_ = fVar48;
          auVar49 = rsqrtss(ZEXT816(0),auVar7);
          fVar28 = auVar49._0_4_;
          fVar29 = fVar28 * -0.5 * (fVar45 * fVar28 * fVar28 + -3.0);
          auVar36._0_4_ = -auVar34._0_4_ * fVar29;
        }
        else if (iVar17 == 4) {
          auVar4._4_4_ = auVar53._0_4_ + fVar45;
          auVar4._0_4_ = fVar29 + fVar45;
          auVar4._8_4_ = auVar39._0_4_ + fVar45;
          auVar4._12_4_ = fVar33 + fVar45;
          auVar49 = rsqrtps(auVar34,auVar4);
          fVar28 = auVar49._0_4_;
          fVar44 = auVar49._4_4_;
          fVar46 = auVar49._8_4_;
          fVar47 = auVar49._12_4_;
          fVar29 = ((fVar29 + fVar45) * fVar28 * fVar28 + -3.0) * fVar28 * -0.5;
          auVar53._0_4_ = ((auVar53._0_4_ + fVar45) * fVar44 * fVar44 + -3.0) * fVar44 * -0.5;
          auVar39._0_4_ = ((auVar39._0_4_ + fVar45) * fVar46 * fVar46 + -3.0) * fVar46 * -0.5;
          fVar33 = ((fVar33 + fVar45) * fVar47 * fVar47 + -3.0) * fVar47 * -0.5;
          auVar36._0_4_ = -auVar36._0_4_ * fVar29;
          fVar30 = -fVar30 * auVar53._0_4_;
          fVar31 = -fVar31 * auVar39._0_4_;
          fVar32 = -fVar32 * fVar33;
        }
        if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
          if (!bVar10) {
            fVar30 = auVar36._0_4_;
            fVar31 = auVar36._0_4_;
            fVar32 = auVar36._0_4_;
            auVar53._0_4_ = fVar29;
            auVar39._0_4_ = fVar29;
            fVar33 = fVar29;
          }
          uVar19 = 0;
          if (3 < (int)uVar18) {
            iVar11 = 4;
            do {
              *pfVar24 = *pfVar24 * fVar29 + auVar36._0_4_;
              pfVar24[1] = pfVar24[1] * auVar53._0_4_ + fVar30;
              pfVar24[2] = pfVar24[2] * auVar39._0_4_ + fVar31;
              pfVar24[3] = pfVar24[3] * fVar33 + fVar32;
              pfVar24 = pfVar24 + 4;
              iVar11 = iVar11 + 4;
              uVar19 = uVar21;
            } while (iVar11 <= (int)uVar18);
          }
          if (uVar18 - uVar19 != 0 && (int)uVar19 <= (int)uVar18) {
            lVar13 = 0;
            do {
              pfVar24[lVar13] = pfVar24[lVar13] * fVar29 + auVar36._0_4_;
              lVar13 = lVar13 + 1;
            } while (uVar18 - uVar19 != (int)lVar13);
          }
        }
        else {
          pfVar15 = pfVar14;
          pfVar26 = local_40;
          if (bVar10 && 3 < (int)uVar18) {
            iVar11 = 4;
            do {
              fVar28 = *pfVar15;
              fVar44 = *pfVar26;
              *pfVar24 = (*pfVar24 * fVar29 + auVar36._0_4_) * fVar28 + fVar44;
              pfVar24[1] = (pfVar24[1] * auVar53._0_4_ + fVar30) * fVar28 + fVar44;
              pfVar24[2] = (pfVar24[2] * auVar39._0_4_ + fVar31) * fVar28 + fVar44;
              pfVar24[3] = (pfVar24[3] * fVar33 + fVar32) * fVar28 + fVar44;
              pfVar24 = pfVar24 + 4;
              pfVar15 = pfVar15 + 1;
              pfVar26 = pfVar26 + 1;
              iVar11 = iVar11 + 4;
            } while (iVar11 <= (int)uVar18);
          }
          if (iVar17 == 1) {
            uVar19 = 0;
            if (3 < (int)uVar18) {
              iVar11 = 4;
              do {
                fVar30 = pfVar15[1];
                fVar31 = pfVar15[2];
                fVar32 = pfVar15[3];
                fVar28 = pfVar26[1];
                auVar53._0_4_ = pfVar26[2];
                auVar39._0_4_ = pfVar26[3];
                *pfVar24 = *pfVar26 + *pfVar15 * (*pfVar24 * fVar29 + auVar36._0_4_);
                pfVar24[1] = fVar28 + fVar30 * (pfVar24[1] * fVar29 + auVar36._0_4_);
                pfVar24[2] = auVar53._0_4_ + fVar31 * (pfVar24[2] * fVar29 + auVar36._0_4_);
                pfVar24[3] = auVar39._0_4_ + fVar32 * (pfVar24[3] * fVar29 + auVar36._0_4_);
                pfVar24 = pfVar24 + 4;
                pfVar15 = pfVar15 + 4;
                pfVar26 = pfVar26 + 4;
                iVar11 = iVar11 + 4;
                uVar19 = uVar21;
              } while (iVar11 <= (int)uVar18);
            }
            if (uVar18 - uVar19 != 0 && (int)uVar19 <= (int)uVar18) {
              lVar13 = 0;
              do {
                pfVar24[lVar13] =
                     (pfVar24[lVar13] * fVar29 + auVar36._0_4_) * pfVar15[lVar13] + pfVar26[lVar13];
                lVar13 = lVar13 + 1;
              } while (uVar18 - uVar19 != (int)lVar13);
            }
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar20);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}